

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_gettimeofday(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pArray_00;
  jx9_value *pVal;
  jx9_value *pArray;
  jx9_value *pValue;
  timeval tv;
  sytime sTime;
  int bFloat;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  sTime.tm_usec._4_4_ = 0;
  gettimeofday((timeval *)&pValue,(__timezone_ptr_t)0x0);
  tv.tv_usec = (__suseconds_t)pValue;
  if (0 < nArg) {
    sTime.tm_usec._4_4_ = jx9_value_to_bool(*apArg);
  }
  if (sTime.tm_usec._4_4_ == 0) {
    pArray_00 = jx9_context_new_array(pCtx);
    pVal = jx9_context_new_scalar(pCtx);
    if ((pVal == (jx9_value *)0x0) || (pArray_00 == (jx9_value *)0x0)) {
      jx9_result_null(pCtx);
    }
    else {
      jx9_value_int64(pVal,tv.tv_usec);
      jx9_array_add_strkey_elem(pArray_00,"sec",pVal);
      jx9_value_int64(pVal,tv.tv_sec);
      jx9_array_add_strkey_elem(pArray_00,"usec",pVal);
      jx9_result_value(pCtx,pArray_00);
    }
  }
  else {
    jx9_result_double(pCtx,(double)tv.tv_usec);
  }
  return 0;
}

Assistant:

static int jx9Builtin_gettimeofday(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int bFloat = 0;
	sytime sTime;
#if defined(__UNIXES__)
	struct timeval tv;
	gettimeofday(&tv, 0);
	sTime.tm_sec  = (long)tv.tv_sec;
	sTime.tm_usec = (long)tv.tv_usec;
#else
	time_t tt;
	time(&tt);
	sTime.tm_sec  = (long)tt;
	sTime.tm_usec = (long)(tt%SX_USEC_PER_SEC);
#endif /* __UNIXES__ */
	if( nArg > 0 ){
		bFloat = jx9_value_to_bool(apArg[0]);
	}
	if( bFloat ){
		/* Return as float */
		jx9_result_double(pCtx, (double)sTime.tm_sec);
	}else{
		/* Return an associative array */
		jx9_value *pValue, *pArray;
		/* Create a new array */
		pArray = jx9_context_new_array(pCtx);
		/* Element value */
		pValue = jx9_context_new_scalar(pCtx);
		if( pValue == 0 || pArray == 0 ){
			/* Return NULL */
			jx9_result_null(pCtx);
			return JX9_OK;
		}
		/* Fill the array */
		/* sec */
		jx9_value_int64(pValue, sTime.tm_sec);
		jx9_array_add_strkey_elem(pArray, "sec", pValue);
		/* usec */
		jx9_value_int64(pValue, sTime.tm_usec);
		jx9_array_add_strkey_elem(pArray, "usec", pValue);
		/* Return the array */
		jx9_result_value(pCtx, pArray);
	}
	return JX9_OK;
}